

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(_func_void *value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_38;
  SimpleString local_28;
  _func_void *value_local;
  
  value_local = value;
  SimpleString::SimpleString(&local_28,"0x");
  HexStringFrom((_func_void *)&local_38);
  SimpleString::operator+((SimpleString *)value,&local_28);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString StringFrom(void (*value)())
{
    return SimpleString("0x") + HexStringFrom(value);
}